

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O3

string * units::getCommodityName_abi_cxx11_(uint32_t commodity)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  iterator iVar5;
  const_iterator cVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  uint uVar10;
  uint in_ESI;
  char cVar11;
  string *in_RDI;
  ulong uVar12;
  string __str;
  uint local_8c;
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  ulong *local_68;
  uint local_60;
  undefined4 uStack_5c;
  ulong local_58 [2];
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  local_8c = in_ESI;
  if ((((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) &&
      (customCommodityNames_abi_cxx11_._24_8_ != 0)) &&
     (iVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)customCommodityNames_abi_cxx11_,&local_8c),
     iVar5.
     super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
     ._M_cur != (__node_type *)0x0)) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    return in_RDI;
  }
  cVar6 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_char_*>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_char_*>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)commodities::commodity_names,&local_8c);
  if (cVar6.super__Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>._M_cur !=
      (__node_type *)0x0) {
    std::__cxx11::string::string
              ((string *)in_RDI,
               *(char **)((long)cVar6.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>
                                ._M_cur + 0x10),(allocator *)&local_88);
    return in_RDI;
  }
  if ((local_8c & 0x7c000000) == 0x40000000) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    cVar11 = (char)in_RDI;
    std::__cxx11::string::push_back(cVar11);
    std::__cxx11::string::push_back(cVar11);
    std::__cxx11::string::push_back(cVar11);
    std::__cxx11::string::push_back(cVar11);
    std::__cxx11::string::push_back(cVar11);
    while( true ) {
      if (in_RDI->_M_string_length == 0) {
        return in_RDI;
      }
      if ((in_RDI->_M_dataplus)._M_p[in_RDI->_M_string_length - 1] != '_') break;
      std::__cxx11::string::pop_back();
    }
    return in_RDI;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CXCOMM[","");
  cVar11 = '\x01';
  if (9 < local_8c) {
    uVar10 = local_8c;
    cVar4 = '\x04';
    do {
      cVar11 = cVar4;
      if (uVar10 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_00171cbc;
      }
      if (uVar10 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_00171cbc;
      }
      if (uVar10 < 10000) goto LAB_00171cbc;
      bVar2 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar4 = cVar11 + '\x04';
    } while (bVar2);
    cVar11 = cVar11 + '\x01';
  }
LAB_00171cbc:
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_68,local_60,local_8c);
  uVar1 = CONCAT44(uStack_5c,local_60) + local_40;
  uVar12 = 0xf;
  if (local_48 != local_38) {
    uVar12 = local_38[0];
  }
  if (uVar12 < uVar1) {
    uVar12 = 0xf;
    if (local_68 != local_58) {
      uVar12 = local_58[0];
    }
    if (uVar1 <= uVar12) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_00171d3e;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
LAB_00171d3e:
  local_88 = &local_78;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_78 = *plVar8;
    uStack_70 = puVar7[3];
  }
  else {
    local_78 = *plVar8;
    local_88 = (long *)*puVar7;
  }
  local_80 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar9) {
    lVar3 = plVar8[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar3;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar8;
    (in_RDI->field_2)._M_allocated_capacity = *psVar9;
  }
  in_RDI->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string getCommodityName(std::uint32_t commodity)
{
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityNames.empty()) {
            auto fnd2 = customCommodityNames.find(commodity);
            if (fnd2 != customCommodityNames.end()) {
                return fnd2->second;
            }
        }
    }
    auto fnd = commodities::commodity_names.find(commodity);
    if (fnd != commodities::commodity_names.end()) {
        return fnd->second;
    }

    if ((commodity & 0x7C000000U) == 0x40000000U) {
        std::string ret;
        ret.push_back((commodity & 0X1FU) + '_');
        ret.push_back(((commodity >> 5U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 10U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 15U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 20U) & 0X1FU) + '_');
        while (!ret.empty() && ret.back() == '_') {
            ret.pop_back();
        }
        return ret;
    }
    return std::string("CXCOMM[") + std::to_string(commodity) + "]";
}